

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_CreateBitSignal(Prs_Ntk_t *pNtk,int Sig)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  
  iVar3 = Abc_Lit2Var2(Sig);
  uVar4 = Abc_Lit2Att2(Sig);
  if (uVar4 < 2) {
    uVar4 = 0xffffffff;
  }
  else if (uVar4 == 2) {
    pcVar7 = Abc_NamStr(pNtk->pFuns,iVar3);
    pcVar7 = strchr(pcVar7,0x27);
    if (pcVar7[1] != 'b') {
      __assert_fail("*pConst == \'b\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                    ,0x679,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
    }
    pcVar7 = pcVar7 + 1;
    bVar2 = true;
    bVar8 = false;
    while( true ) {
      pcVar7 = pcVar7 + 1;
      cVar1 = *pcVar7;
      if (cVar1 == '\0') break;
      if (cVar1 == '0') {
        bVar2 = false;
      }
      else if (cVar1 == '1') {
        bVar8 = true;
      }
    }
    if (bVar8) {
      uVar4 = -(uint)!bVar2 | 10;
    }
    else {
      uVar4 = 6;
    }
  }
  else {
    Prs_CatSignals(pNtk,iVar3);
    iVar9 = -1;
    for (iVar3 = 0; iVar3 < Prs_CatSignals::V.nSize; iVar3 = iVar3 + 1) {
      iVar5 = Vec_IntEntry(&Prs_CatSignals::V,iVar3);
      iVar6 = Abc_Lit2Var2(iVar5);
      iVar5 = Abc_Lit2Att2(iVar5);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = iVar6;
      if ((iVar9 != -1) && (iVar5 = iVar9, iVar9 != iVar6)) {
        return -1;
      }
      iVar9 = iVar5;
    }
    if (iVar9 < 0) {
      __assert_fail("SigOne >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                    ,0x692,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
    }
    uVar4 = iVar9 << 2;
  }
  return uVar4;
}

Assistant:

int Prs_CreateBitSignal( Prs_Ntk_t * pNtk, int Sig )
{
    Vec_Int_t * vSigs;
    int i, SigTemp, SigOne = -1, Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME || Type == CBA_PRS_SLICE )
        return -1;
    if ( Type == CBA_PRS_CONST )
    {
        int fOnly0 = 1, fOnly1 = 1;
        char * pConst = Prs_NtkConst(pNtk, Value);
        pConst = strchr( pConst, '\'' ) + 1;
        assert( *pConst == 'b' );
        while ( *++pConst )
            if ( *pConst == '0' )
                fOnly1 = 0;
            else if ( *pConst == '1' )
                fOnly0 = 0;
        if ( fOnly0 )
            return Abc_Var2Lit2( 1, CBA_PRS_CONST ); // const0
        if ( fOnly1 )
            return Abc_Var2Lit2( 2, CBA_PRS_CONST ); // const1
        return -1;
    }
    assert( Type == CBA_PRS_CONCAT );
    vSigs = Prs_CatSignals( pNtk, Value );
    Vec_IntForEachEntry( vSigs, SigTemp, i )
    {
        Value = Abc_Lit2Var2( SigTemp );
        Type = (Prs_ManType_t)Abc_Lit2Att2( SigTemp );
        if ( Type != CBA_PRS_NAME )
            return -1;
        if ( SigOne == -1 )
            SigOne = Value;
        else if ( SigOne != Value )
            return -1;
    }
    assert( SigOne >= 0 );
    return Abc_Var2Lit2( SigOne, CBA_PRS_NAME );
}